

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_dependencies.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBDependenciesInit(ClientContext *context,TableFunctionInitInput *input)

{
  int iVar1;
  Catalog *pCVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  templated_unique_single_t result;
  optional_ptr<duckdb::DependencyManager,_true> dependency_manager;
  element_type *local_58;
  optional_ptr<duckdb::DependencyManager,_true> local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_58 = (element_type *)operator_new(0x28);
  *(undefined ***)&(local_58->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ =
       &PTR__DuckDBDependenciesData_019b94c8;
  (local_58->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_58->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = 0;
  (local_58->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&local_58->interrupted = 0;
  local_48._M_unused._M_object = &local_38;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_647c332 + 9);
  pCVar2 = Catalog::GetCatalog((ClientContext *)input,(string *)&local_48);
  if ((code **)local_48._M_unused._0_8_ != &local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  iVar1 = (*pCVar2->_vptr_Catalog[0x1a])(pCVar2);
  local_50.ptr = (DependencyManager *)CONCAT44(extraout_var,iVar1);
  if (local_50.ptr != (DependencyManager *)0x0) {
    optional_ptr<duckdb::DependencyManager,_true>::CheckValid(&local_50);
    local_48._8_8_ = 0;
    pcStack_30 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_dependencies.cpp:63:16)>
                 ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_dependencies.cpp:63:16)>
               ::_M_manager;
    local_48._M_unused._M_object = &local_58;
    DependencyManager::Scan
              (local_50.ptr,(ClientContext *)input,
               (function<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&)>
                *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBDependenciesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBDependenciesData>();

	// scan all the schemas and collect them
	auto &catalog = Catalog::GetCatalog(context, INVALID_CATALOG);
	auto dependency_manager = catalog.GetDependencyManager();
	if (dependency_manager) {
		dependency_manager->Scan(
		    context, [&](CatalogEntry &obj, CatalogEntry &dependent, const DependencyDependentFlags &flags) {
			    result->entries.emplace_back(obj, dependent, flags);
		    });
	}

	return std::move(result);
}